

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O2

void jsimd_h2v2_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  uint uVar1;
  code *UNRECOVERED_JUMPTABLE;
  code *pcVar2;
  
  uVar1 = cinfo->out_color_space - JCS_EXT_RGB;
  if (uVar1 < 10) {
    UNRECOVERED_JUMPTABLE = (code *)(&PTR_jsimd_h2v2_extrgb_merged_upsample_avx2_00156bf0)[uVar1];
    pcVar2 = (code *)(&PTR_jsimd_h2v2_extrgb_merged_upsample_sse2_00156c40)[uVar1];
  }
  else {
    pcVar2 = jsimd_h2v2_merged_upsample_sse2;
    UNRECOVERED_JUMPTABLE = jsimd_h2v2_merged_upsample_avx2;
  }
  if (-1 < (char)simd_support) {
    UNRECOVERED_JUMPTABLE = pcVar2;
  }
  (*UNRECOVERED_JUMPTABLE)(cinfo->output_width);
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v2_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                           JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  void (*avx2fct) (JDIMENSION, JSAMPIMAGE, JDIMENSION, JSAMPARRAY);
  void (*sse2fct) (JDIMENSION, JSAMPIMAGE, JDIMENSION, JSAMPARRAY);

  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    avx2fct = jsimd_h2v2_extrgb_merged_upsample_avx2;
    sse2fct = jsimd_h2v2_extrgb_merged_upsample_sse2;
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    avx2fct = jsimd_h2v2_extrgbx_merged_upsample_avx2;
    sse2fct = jsimd_h2v2_extrgbx_merged_upsample_sse2;
    break;
  case JCS_EXT_BGR:
    avx2fct = jsimd_h2v2_extbgr_merged_upsample_avx2;
    sse2fct = jsimd_h2v2_extbgr_merged_upsample_sse2;
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    avx2fct = jsimd_h2v2_extbgrx_merged_upsample_avx2;
    sse2fct = jsimd_h2v2_extbgrx_merged_upsample_sse2;
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    avx2fct = jsimd_h2v2_extxbgr_merged_upsample_avx2;
    sse2fct = jsimd_h2v2_extxbgr_merged_upsample_sse2;
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    avx2fct = jsimd_h2v2_extxrgb_merged_upsample_avx2;
    sse2fct = jsimd_h2v2_extxrgb_merged_upsample_sse2;
    break;
  default:
    avx2fct = jsimd_h2v2_merged_upsample_avx2;
    sse2fct = jsimd_h2v2_merged_upsample_sse2;
    break;
  }

  if (simd_support & JSIMD_AVX2)
    avx2fct(cinfo->output_width, input_buf, in_row_group_ctr, output_buf);
  else
    sse2fct(cinfo->output_width, input_buf, in_row_group_ctr, output_buf);
}